

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDevice.cpp
# Opt level: O2

bool __thiscall BlockDevice::ReadMakeModelRevisionSerial(BlockDevice *this,string *path)

{
  uint __fd;
  int iVar1;
  BlockDevice *pBVar2;
  bool bVar3;
  string s_1;
  undefined1 local_a8 [32];
  string s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68 [4];
  
  __fd = (this->super_HDD).h;
  pBVar2 = (BlockDevice *)(ulong)__fd;
  iVar1 = ioctl(__fd,0x30d,&ReadMakeModelRevisionSerial::hd);
  if (iVar1 == 0) {
    s._M_dataplus._M_p = (pointer)&s.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&s,0x1e02a6,0x1e02ce);
    util::trim(&s_1,&s);
    std::__cxx11::string::operator=((string *)&(this->super_HDD).strMakeModel,(string *)&s_1);
    std::__cxx11::string::~string((string *)&s_1);
    s_1._M_dataplus._M_p = (pointer)&s_1.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&s_1,0x1e0284,0x1e0298);
    std::__cxx11::string::operator=((string *)&s,(string *)&s_1);
    std::__cxx11::string::~string((string *)&s_1);
    util::trim(&s_1,&s);
    std::__cxx11::string::operator=((string *)&(this->super_HDD).strSerialNumber,(string *)&s_1);
    std::__cxx11::string::~string((string *)&s_1);
    s_1.field_2._0_1_ = ReadMakeModelRevisionSerial::hd.fw_rev[0];
    s_1.field_2._1_1_ = ReadMakeModelRevisionSerial::hd.fw_rev[1];
    s_1.field_2._2_1_ = ReadMakeModelRevisionSerial::hd.fw_rev[2];
    s_1.field_2._3_1_ = ReadMakeModelRevisionSerial::hd.fw_rev[3];
    s_1.field_2._4_1_ = ReadMakeModelRevisionSerial::hd.fw_rev[4];
    s_1.field_2._5_1_ = ReadMakeModelRevisionSerial::hd.fw_rev[5];
    s_1.field_2._6_1_ = ReadMakeModelRevisionSerial::hd.fw_rev[6];
    s_1.field_2._7_1_ = ReadMakeModelRevisionSerial::hd.fw_rev[7];
    s_1._M_string_length = 8;
    s_1.field_2._M_local_buf[8] = '\0';
    s_1._M_dataplus._M_p = (pointer)&s_1.field_2;
    std::__cxx11::string::operator=((string *)&s,(string *)&s_1);
    std::__cxx11::string::~string((string *)&s_1);
    util::trim(&s_1,&s);
    std::__cxx11::string::operator=((string *)&(this->super_HDD).strFirmwareRevision,(string *)&s_1)
    ;
    std::__cxx11::string::~string((string *)&s_1);
    std::__cxx11::string::~string((string *)&s);
    bVar3 = true;
  }
  else {
    iVar1 = ScsiCmd(pBVar2,(this->super_HDD).h,"\x12",6,&s,0x60,true);
    bVar3 = iVar1 == 0;
    if (bVar3) {
      s_1._M_dataplus._M_p = (pointer)&s_1.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&s_1,&s.field_2,local_68);
      util::trim((string *)local_a8,&s_1);
      std::__cxx11::string::operator=((string *)&(this->super_HDD).strMakeModel,(string *)local_a8);
      std::__cxx11::string::~string((string *)local_a8);
      local_a8._0_8_ = local_a8 + 0x10;
      local_a8._16_4_ = (undefined4)local_68[0]._M_allocated_capacity;
      local_a8._8_8_ = 4;
      local_a8[0x14] = '\0';
      std::__cxx11::string::operator=((string *)&s_1,(string *)local_a8);
      std::__cxx11::string::~string((string *)local_a8);
      util::trim((string *)local_a8,&s_1);
      pBVar2 = (BlockDevice *)local_a8;
      std::__cxx11::string::operator=
                ((string *)&(this->super_HDD).strFirmwareRevision,(string *)pBVar2);
      std::__cxx11::string::~string((string *)pBVar2);
      ScsiCmd(pBVar2,(this->super_HDD).h,ReadMakeModelRevisionSerial::cmdSerial,6,&s,0x60,true);
      std::__cxx11::string::~string((string *)&s_1);
    }
  }
  return bVar3;
}

Assistant:

bool BlockDevice::ReadMakeModelRevisionSerial(const std::string& path)
{
#ifdef _WIN32
    (void)path; // unused
    MEMORY mem(512);
    PSTORAGE_DEVICE_DESCRIPTOR pDevDesc = reinterpret_cast<PSTORAGE_DEVICE_DESCRIPTOR>(mem.pb);
    pDevDesc->Size = static_cast<DWORD>(mem.size);

    STORAGE_PROPERTY_QUERY spq;
    spq.QueryType = PropertyStandardQuery;
    spq.PropertyId = StorageDeviceProperty;

    DWORD dwRet;
    HANDLE hdevice = reinterpret_cast<HANDLE>(_get_osfhandle(this->h));
    if (DeviceIoControl(hdevice, IOCTL_STORAGE_QUERY_PROPERTY, &spq, sizeof(spq), pDevDesc, pDevDesc->Size, &dwRet, nullptr) && pDevDesc->ProductIdOffset)
    {
        // We've read something, so clear existing values
        strMakeModel = strFirmwareRevision = strSerialNumber = "";

        if (pDevDesc->VendorIdOffset)
        {
            std::string s(reinterpret_cast<char*>(pDevDesc) + pDevDesc->VendorIdOffset);
            strMakeModel = util::trim(s);
        }

        if (pDevDesc->ProductIdOffset)
        {
            std::string s(reinterpret_cast<char*>(pDevDesc) + pDevDesc->ProductIdOffset);
            strMakeModel += util::trim(s);
        }

        if (pDevDesc->ProductRevisionOffset)
        {
            std::string s(reinterpret_cast<char*>(pDevDesc) + pDevDesc->ProductRevisionOffset);
            strFirmwareRevision = util::trim(s);
        }

        if (pDevDesc->SerialNumberOffset)
        {
            std::string s(reinterpret_cast<char*>(pDevDesc) + pDevDesc->SerialNumberOffset);
            strSerialNumber = util::trim(s);
        }

        return true;
    }
#endif // WIN32

#ifdef HAVE_LINUX_HDREG_H
    (void)path; // unused
    static struct hd_driveid hd;

    // ATA query
    if (!ioctl(h, HDIO_GET_IDENTITY, &hd))
    {
        std::string s = std::string(reinterpret_cast<const char*>(hd.model), 40);
        strMakeModel = util::trim(s);

        s = std::string(reinterpret_cast<const char*>(hd.serial_no), 20);
        strSerialNumber = util::trim(s);

        s = std::string(reinterpret_cast<const char*>(hd.fw_rev), 8);
        strFirmwareRevision = util::trim(s);

        return true;
    }
#endif // HDIO_GET_IDENTITY

#if defined(HAVE_SCSI_SCSI_H) && defined(HAVE_SCSI_SG_H)
    // SCSI query
    {
        uint8_t buf[96];

        static const uint8_t cmdInquiry[] = {
            INQUIRY, 0, 0, 0, sizeof(buf), 0
        };
        static const uint8_t cmdSerial[] = {
            INQUIRY, 0x01, 0x80, 0, sizeof(buf), 0
        };

        // Read the device details
        if (ScsiCmd(h, cmdInquiry, sizeof(cmdInquiry), buf, sizeof(buf), true) == 0)
        {
            /*
                        // Vendor identification (8-15)
                        std::string s = std::string(reinterpret_cast<char*>(buf+8), 8);
                        strMakeModel = util::trim(s);
            */
            // Product identification (16-31)
            auto s = std::string(reinterpret_cast<char*>(buf + 16), 16);
            strMakeModel = util::trim(s);

            // Product revision level (32-35)
            s = std::string(reinterpret_cast<char*>(buf + 32), 4);
            strFirmwareRevision = util::trim(s);

            // Read the device serial number
            if (ScsiCmd(h, cmdSerial, sizeof(cmdSerial), buf, sizeof(buf), true) == 0)
            {
                if (buf[1] == 0x80) // Page 80h = Unit serial number
                {
                    s = std::string(reinterpret_cast<char*>(buf + 4), buf[3]);
                    strSerialNumber = util::trim(s);
                }
            }

            return true;
        }
    }
#endif

#if defined(HAVE_DISKARBITRATION_DISKARBITRATION_H)
    DASessionRef session = DASessionCreate(kCFAllocatorDefault);
    DADiskRef disk = DADiskCreateFromBSDName(kCFAllocatorDefault, session, path.c_str());
    if (disk)
    {
        CFDictionaryRef diskInfo = DADiskCopyDescription(disk);
        if (diskInfo)
        {
            // Clear existing values
            strMakeModel = strFirmwareRevision = strSerialNumber = "";

            auto strVendor = static_cast<CFStringRef>(CFDictionaryGetValue(diskInfo, kDADiskDescriptionDeviceVendorKey));
            auto strModel = static_cast<CFStringRef>(CFDictionaryGetValue(diskInfo, kDADiskDescriptionDeviceModelKey));
            auto strRevision = static_cast<CFStringRef>(CFDictionaryGetValue(diskInfo, kDADiskDescriptionDeviceRevisionKey));

            if (strVendor)
            {
                std::string s = CFStringGetCStringPtr(strVendor, 0);
                strMakeModel = util::trim(s);
            }

            if (strModel)
            {
                std::string s = CFStringGetCStringPtr(strModel, 0);
                strMakeModel += util::trim(s);
            }

            if (strRevision)
            {
                std::string s = CFStringGetCStringPtr(strRevision, 0);
                strFirmwareRevision = util::trim(s);
            }

            CFRelease(diskInfo);
        }

        CFRelease(disk);
        CFRelease(session);
    }
#endif // HAVE_DISKARBITRATION_DISKARBITRATION_H

    return false;
}